

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxDoWhileLoop::DoResolve(FxDoWhileLoop *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxBoolCast *this_00;
  undefined4 extraout_var_01;
  FxExpression *size;
  FxDoWhileLoop *local_48;
  FxExpression *e;
  FCompileContext *local_20;
  FCompileContext *ctx_local;
  FxDoWhileLoop *this_local;
  
  this_local = this;
  if (((this->super_FxLoopStatement).super_FxExpression.isresolved & 1U) == 0) {
    (this->super_FxLoopStatement).super_FxExpression.isresolved = true;
    local_20 = ctx;
    ctx_local = (FCompileContext *)this;
    if (this->Condition != (FxExpression *)0x0) {
      iVar2 = (*this->Condition->_vptr_FxExpression[2])();
      this->Condition = (FxExpression *)CONCAT44(extraout_var,iVar2);
    }
    if (this->Condition == (FxExpression *)0x0) {
      if (this != (FxDoWhileLoop *)0x0) {
        (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])();
      }
      this_local = (FxDoWhileLoop *)0x0;
    }
    else {
      if (this->Code != (FxExpression *)0x0) {
        if (this->Code != (FxExpression *)0x0) {
          ctx = local_20;
          iVar2 = (*this->Code->_vptr_FxExpression[2])();
          this->Code = (FxExpression *)CONCAT44(extraout_var_00,iVar2);
        }
        if (this->Code == (FxExpression *)0x0) {
          if (this != (FxDoWhileLoop *)0x0) {
            (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
      }
      if (this->Condition->ValueType != (PType *)TypeBool) {
        this_00 = (FxBoolCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)ctx);
        FxBoolCast::FxBoolCast(this_00,this->Condition,true);
        this->Condition = (FxExpression *)this_00;
        if (this->Condition != (FxExpression *)0x0) {
          iVar2 = (*this->Condition->_vptr_FxExpression[2])(this->Condition,local_20);
          this->Condition = (FxExpression *)CONCAT44(extraout_var_01,iVar2);
        }
        if (this->Condition == (FxExpression *)0x0) {
          if (this != (FxDoWhileLoop *)0x0) {
            (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])();
          }
          return (FxExpression *)0x0;
        }
      }
      uVar3 = (*this->Condition->_vptr_FxExpression[3])();
      if ((uVar3 & 1) != 0) {
        size = this->Condition;
        FxConstant::GetValue((FxConstant *)&e);
        bVar1 = ExpVal::GetBool((ExpVal *)&e);
        ExpVal::~ExpVal((ExpVal *)&e);
        if (bVar1) {
          if (this->Code == (FxExpression *)0x0) {
            FScriptPosition::Message
                      (&(this->super_FxLoopStatement).super_FxExpression.ScriptPosition,0,
                       "Infinite empty loop");
          }
        }
        else {
          uVar3 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::Size
                            (&(this->super_FxLoopStatement).Jumps);
          if (uVar3 == 0) {
            local_48 = (FxDoWhileLoop *)this->Code;
            if (local_48 == (FxDoWhileLoop *)0x0) {
              local_48 = (FxDoWhileLoop *)
                         FxExpression::operator_new((FxExpression *)0x28,(size_t)size);
              FxNop::FxNop((FxNop *)local_48,
                           &(this->super_FxLoopStatement).super_FxExpression.ScriptPosition);
            }
            this->Code = (FxExpression *)0x0;
            if (this != (FxDoWhileLoop *)0x0) {
              (*(this->super_FxLoopStatement).super_FxExpression._vptr_FxExpression[1])();
            }
            this_local = local_48;
          }
        }
      }
    }
  }
  return (FxExpression *)this_local;
}

Assistant:

FxExpression *FxDoWhileLoop::DoResolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Condition, ctx);
	SAFE_RESOLVE_OPT(Code, ctx);

	if (Condition->ValueType != TypeBool)
	{
		Condition = new FxBoolCast(Condition);
		SAFE_RESOLVE(Condition, ctx);
	}

	if (Condition->isConstant())
	{
		if (static_cast<FxConstant *>(Condition)->GetValue().GetBool() == false)
		{ // The code executes once, if any.
			if (Jumps.Size() == 0)
			{ // We would still have to handle the jumps however.
				FxExpression *e = Code;
				if (e == nullptr) e = new FxNop(ScriptPosition);
				Code = nullptr;
				delete this;
				return e;
			}
		}
		else if (Code == nullptr)
		{ // "do { } while (true);"
		  // Someone could be using this for testing.
			ScriptPosition.Message(MSG_WARNING, "Infinite empty loop");
		}
	}

	return this;
}